

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squared_loss_test.cc
# Opt level: O2

void __thiscall xLearn::SQUARED_LOSS_Evaluate_Test::TestBody(SQUARED_LOSS_Evaluate_Test *this)

{
  uint uVar1;
  Score *score;
  ThreadPool *this_00;
  int i;
  int iVar2;
  ulong uVar3;
  int i_1;
  char *message;
  float fVar4;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar5 [16];
  undefined1 extraout_var [56];
  AssertHelper local_a0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  AssertionResult gtest_ar;
  vector<float,_std::allocator<float>_> label;
  vector<float,_std::allocator<float>_> pred;
  SquaredLoss loss;
  undefined1 auVar6 [64];
  
  std::vector<float,_std::allocator<float>_>::vector(&pred,(ulong)kLine,(allocator_type *)&loss);
  for (uVar3 = 0;
      uVar3 < (ulong)((long)pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar3 = uVar3 + 1) {
    pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
    [uVar3] = (float)(int)uVar3;
  }
  std::vector<float,_std::allocator<float>_>::vector(&label,(ulong)kLine,(allocator_type *)&loss);
  iVar2 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)label.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)label.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar3 = uVar3 + 1) {
    fVar4 = (float)iVar2;
    iVar2 = iVar2 + 2;
    label.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
    [uVar3] = fVar4;
  }
  loss.super_Loss.loss_sum_ = 0.0;
  loss.super_Loss.total_example_ = 0;
  loss.super_Loss._vptr_Loss = (_func_int **)&PTR__Loss_0016dda8;
  score = (Score *)operator_new(0x58);
  (score->opt_type_)._M_dataplus._M_p = (pointer)&(score->opt_type_).field_2;
  (score->opt_type_)._M_string_length = 0;
  (score->opt_type_).field_2._M_local_buf[0] = '\0';
  score->_vptr_Score = (_func_int **)&PTR__Score_0016e3d8;
  score[1].alpha_ = 0.0;
  score[1].beta_ = 0.0;
  score[1]._vptr_Score = (_func_int **)0x0;
  score[1].learning_rate_ = 0.0;
  score[1].regu_lambda_ = 0.0;
  uVar1 = std::thread::hardware_concurrency();
  auVar6._8_56_ = extraout_var;
  auVar6._0_8_ = extraout_XMM1_Qa;
  auVar5 = auVar6._0_16_;
  this_00 = (ThreadPool *)operator_new(0x120);
  ThreadPool::ThreadPool(this_00,(ulong)uVar1);
  Loss::Initialize(&loss.super_Loss,score,this_00,true,false,0);
  SquaredLoss::Evaluate(&loss,&pred,&label);
  auVar5 = vcvtusi2ss_avx512f(auVar5,loss.super_Loss.total_example_);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&gtest_ar,"val","14.25",loss.super_Loss.loss_sum_ / auVar5._0_4_,14.25);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/squared_loss_test.cc"
               ,0x33,message);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_98);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&label.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&pred.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

TEST(SQUARED_LOSS, Evaluate) {
  // Create pred vector
  std::vector<real_t> pred(kLine);
  for (int i = 0; i < pred.size(); ++i) {
    pred[i] = i;
  }
  // Create label vector
  std::vector<real_t> label(kLine);
  for (int i = 0; i < label.size(); ++i) {
    label[i] = 2*i;
  }
  // Create loss
  SquaredLoss loss;
  Score* score = new FMScore;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  loss.Initialize(score, pool);
  loss.Evaluate(pred, label);
  real_t val = loss.GetLoss();
  EXPECT_FLOAT_EQ(val, 14.25);
}